

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void ssh_bpp_common_setup(BinaryPacketProtocol *bpp)

{
  (bpp->in_pq).pqb.end.prev = (PacketQueueNode *)&bpp->in_pq;
  (bpp->in_pq).pqb.end.next = (PacketQueueNode *)&bpp->in_pq;
  (bpp->in_pq).after = pq_in_after;
  (bpp->in_pq).pqb.total_size = 0;
  (bpp->in_pq).pqb.ic = (IdempotentCallback *)0x0;
  (bpp->out_pq).pqb.end.prev = (PacketQueueNode *)&bpp->out_pq;
  (bpp->out_pq).pqb.end.next = (PacketQueueNode *)&bpp->out_pq;
  (bpp->out_pq).after = pq_out_after;
  (bpp->out_pq).pqb.total_size = 0;
  bpp->input_eof = false;
  (bpp->ic_in_raw).fn = ssh_bpp_input_raw_data_callback;
  (bpp->ic_in_raw).ctx = bpp;
  (bpp->ic_out_pq).fn = ssh_bpp_output_packet_callback;
  (bpp->ic_out_pq).ctx = bpp;
  (bpp->out_pq).pqb.ic = &bpp->ic_out_pq;
  return;
}

Assistant:

void ssh_bpp_common_setup(BinaryPacketProtocol *bpp)
{
    pq_in_init(&bpp->in_pq);
    pq_out_init(&bpp->out_pq);
    bpp->input_eof = false;
    bpp->ic_in_raw.fn = ssh_bpp_input_raw_data_callback;
    bpp->ic_in_raw.ctx = bpp;
    bpp->ic_out_pq.fn = ssh_bpp_output_packet_callback;
    bpp->ic_out_pq.ctx = bpp;
    bpp->out_pq.pqb.ic = &bpp->ic_out_pq;
}